

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::printSolution(HModel *this)

{
  value_type vVar1;
  double dVar2;
  _Setw _Var3;
  reference pvVar4;
  reference pvVar5;
  ostream *poVar6;
  ostream *poVar7;
  long in_RDI;
  int i_7;
  int i_6;
  int i_5;
  int i_4;
  char buff [5];
  int i_3;
  int i_2;
  int i_1;
  int i;
  double *valuePtr;
  vector<double,_std::allocator<double>_> rowDual;
  vector<double,_std::allocator<double>_> rowValue;
  vector<double,_std::allocator<double>_> colDual;
  vector<double,_std::allocator<double>_> colValue;
  int iTot;
  int iRow_2;
  int iCol;
  int iRow_1;
  vector<double,_std::allocator<double>_> dual;
  int iRow;
  vector<double,_std::allocator<double>_> value;
  allocator_type *in_stack_fffffffffffffe00;
  size_type in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  int local_11c;
  int local_114;
  int local_10c;
  int local_104;
  char local_fd [5];
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  reference local_e8;
  vector<double,_std::allocator<double>_> local_d8;
  vector<double,_std::allocator<double>_> local_b8;
  vector<double,_std::allocator<double>_> local_98;
  vector<double,_std::allocator<double>_> local_78;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  vector<double,_std::allocator<double>_> local_40;
  int local_24;
  vector<double,_std::allocator<double>_> local_20;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),in_stack_fffffffffffffe38
            );
  for (local_24 = 0; local_24 < *(int *)(in_RDI + 0x610); local_24 = local_24 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x870),(long)local_24);
    vVar1 = *pvVar4;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x750),(long)local_24);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_20,(long)*pvVar5);
    *pvVar4 = vVar1;
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),in_stack_fffffffffffffe38
            );
  for (local_50 = 0; local_50 < *(int *)(in_RDI + 0x610); local_50 = local_50 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x750),(long)local_50);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,(long)*pvVar5);
    *pvVar4 = 0.0;
  }
  for (local_54 = 0; local_54 < *(int *)(in_RDI + 0x60c); local_54 = local_54 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6d8),(long)local_54);
    dVar2 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_20,(long)local_54);
    *pvVar4 = dVar2 * *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6d8),(long)local_54);
    dVar2 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,(long)local_54);
    *pvVar4 = *pvVar4 / dVar2;
  }
  local_58 = 0;
  local_5c = *(int *)(in_RDI + 0x60c);
  for (; local_58 < *(int *)(in_RDI + 0x610); local_58 = local_58 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x720),(long)local_58);
    dVar2 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_20,(long)local_5c);
    *pvVar4 = *pvVar4 / dVar2;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x720),(long)local_58);
    dVar2 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,(long)local_5c);
    *pvVar4 = dVar2 * *pvVar4;
    local_5c = local_5c + 1;
  }
  std::allocator<double>::allocator((allocator<double> *)0x173fda);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),in_stack_fffffffffffffe08
             ,in_stack_fffffffffffffe00);
  std::allocator<double>::~allocator((allocator<double> *)0x174006);
  std::allocator<double>::allocator((allocator<double> *)0x174032);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),in_stack_fffffffffffffe08
             ,in_stack_fffffffffffffe00);
  std::allocator<double>::~allocator((allocator<double> *)0x17405e);
  std::allocator<double>::allocator((allocator<double> *)0x17408a);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),in_stack_fffffffffffffe08
             ,in_stack_fffffffffffffe00);
  std::allocator<double>::~allocator((allocator<double> *)0x1740b6);
  std::allocator<double>::allocator((allocator<double> *)0x1740e2);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),in_stack_fffffffffffffe08
             ,in_stack_fffffffffffffe00);
  std::allocator<double>::~allocator((allocator<double> *)0x17410e);
  local_e8 = std::vector<double,_std::allocator<double>_>::operator[](&local_20,0);
  for (local_ec = 0; local_ec < *(int *)(in_RDI + 0x610); local_ec = local_ec + 1) {
    vVar1 = local_e8[local_ec + *(int *)(in_RDI + 0x60c)];
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_b8,(long)local_ec);
    *pvVar4 = -vVar1;
  }
  for (local_f0 = 0; local_f0 < *(int *)(in_RDI + 0x60c); local_f0 = local_f0 + 1) {
    vVar1 = local_e8[local_f0];
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_78,(long)local_f0);
    *pvVar4 = vVar1;
  }
  for (local_f4 = 0; local_f4 < *(int *)(in_RDI + 0x610); local_f4 = local_f4 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&local_40,(long)(local_f4 + *(int *)(in_RDI + 0x60c)));
    vVar1 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_d8,(long)local_f4);
    *pvVar4 = vVar1;
  }
  for (local_f8 = 0; local_f8 < *(int *)(in_RDI + 0x60c); local_f8 = local_f8 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,(long)local_f8);
    vVar1 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_98,(long)local_f8);
    *pvVar4 = vVar1;
  }
  poVar6 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar6,"Col value: ");
  for (local_104 = 0; local_104 < *(int *)(in_RDI + 0x60c); local_104 = local_104 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_78,(long)local_104);
    sprintf(local_fd,"%2.2f ",*pvVar4);
    _Var3 = std::setw(5);
    poVar6 = std::operator<<((ostream *)&std::cout,_Var3);
    std::operator<<(poVar6,local_fd);
  }
  poVar6 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar6,"Col dual:  ");
  for (local_10c = 0; local_10c < *(int *)(in_RDI + 0x60c); local_10c = local_10c + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_98,(long)local_10c);
    sprintf(local_fd,"%2.2f ",*pvVar4);
    _Var3 = std::setw(5);
    poVar6 = std::operator<<((ostream *)&std::cout,_Var3);
    std::operator<<(poVar6,local_fd);
  }
  poVar6 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar6,"Row value: ");
  for (local_114 = 0; local_114 < *(int *)(in_RDI + 0x610); local_114 = local_114 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_b8,(long)local_114);
    sprintf(local_fd,"%2.2f ",*pvVar4);
    _Var3 = std::setw(5);
    poVar6 = std::operator<<((ostream *)&std::cout,_Var3);
    std::operator<<(poVar6,local_fd);
  }
  poVar6 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar6,"Row dual:  ");
  for (local_11c = 0; local_11c < *(int *)(in_RDI + 0x610); local_11c = local_11c + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_d8,(long)local_11c);
    sprintf(local_fd,"%2.2f ",*pvVar4);
    _Var3 = std::setw(5);
    poVar7 = std::operator<<((ostream *)&std::cout,_Var3);
    std::operator<<(poVar7,local_fd);
  }
  poVar7 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)poVar6);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)poVar6);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)poVar6);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)poVar6);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)poVar6);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)poVar6);
  return;
}

Assistant:

void HModel::printSolution() {

	//*************** part 1 : in .solve() 
	// Take primal solution
	vector<double> value = workValue;
	for (int iRow = 0; iRow < numRow; iRow++)
		value[basicIndex[iRow]] = baseValue[iRow];

	// Take dual solution
	vector<double> dual = workDual;
	for (int iRow = 0; iRow < numRow; iRow++)
		dual[basicIndex[iRow]] = 0;

	// Take non basic flag and move don't need those?
	//houtput.Nflag = Nflag_;
	//houtput.Nmove = Nmove_;

	// Scale back 
	for (int iCol = 0; iCol < numCol; iCol++) {
		value[iCol] *= colScale[iCol];
		dual[iCol] /= colScale[iCol];

	}
	for (int iRow = 0, iTot = numCol; iRow < numRow; iRow++, iTot++) {
		value[iTot] /= rowScale[iRow];
		dual[iTot] *= rowScale[iRow];
	}
	
	//************** part 2: gepr and gedu

	// Now we can get the solution
	vector<double> colValue(numCol), colDual(numCol); 
	vector<double> rowValue(numRow), rowDual(numRow);
	
	// hems_gepr hems_gedu after model has been solved 
	// always call that function with numRow + 1 for rowListSize and same for col 
	//hems_gepr(&returnCode, 0, numRow + 1), numCol + 1, 0, 0, &rowValue[0], &colValue[0]);
	double *valuePtr = &value[0];
//    if (rowListSize > numRow) {
        for (int i = 0; i < numRow; i++)
            rowValue[i] = -valuePtr[i + numCol];
//    } else {
//        for (int i = 0; i < rowListSize; i++)
//            rowValue[i] = -valuePtr[rowList[i] + numCol - 1];
//    }
//    if (colListSize > numCol) {
        for (int i = 0; i < numCol; i++)
            colValue[i] = valuePtr[i];
//    } else {
 //       for (int i = 0; i < colListSize; i++)
  //          colValue[i] = valuePtr[colList[i] - 1];
   // }
    
    //hems_gedu(&returnCode, 0, numRow + 1, numCol + 1, 0, 0, &rowDual[0], &colDual[0]);
	
//    if (rowListSize > numRow) {
        for (int i = 0; i < numRow; i++)
            rowDual[i] = dual[i + numCol];
//    } else {
  //      for (int i = 0; i < rowListSize; i++)
   //         rowDual[i] = dual[rowList[i] + numCol - 1];
   // }

 //   if (colListSize > numCol) {
        for (int i = 0; i < numCol; i++)
            colDual[i] = dual[i];
 //   } else {
  //      for (int i = 0; i < colListSize; i++)
   //         colDual[i] = dual[colList[i] - 1];
   // }
    //*rtcod = 0;*/
    
    char buff [5];
    cout<<endl<<"Col value: ";
    for (int i=0;i<numCol;i++) {
    	sprintf(buff, "%2.2f ", colValue[i]); 
    	cout<<setw(5)<<buff; }  //cout<< colValue[i] <<" ";
    cout<<endl<<"Col dual:  ";
    for (int i=0;i<numCol;i++) {
    	sprintf(buff, "%2.2f ", colDual[i]);
    	cout<<setw(5)<<buff; }  //cout<< colDual[i] <<" ";
    cout<<endl<<"Row value: ";
    for (int i=0;i<numRow;i++) {
      	sprintf(buff, "%2.2f ", rowValue[i]);  
      	cout<<setw(5)<<buff; }  //cout<< rowValue[i] <<" ";
    cout<<endl<<"Row dual:  ";
    for (int i=0;i<numRow;i++) {
    	sprintf(buff, "%2.2f ", rowDual[i]);  
    	cout<<setw(5)<<buff; }  //cout<< rowDual[i] <<" "; 
    cout<<endl<<endl;
}